

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

_Bool GPU_SaveSurface(SDL_Surface *surface,char *filename,GPU_FileFormatEnum format)

{
  byte *pbVar1;
  int y;
  void *data;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  if (((filename == (char *)0x0 || surface == (SDL_Surface *)0x0) || (iVar2 = surface->w, iVar2 < 1)
      ) || (y = surface->h, y < 1)) {
    return false;
  }
  if (GPU_FILE_TGA < format) {
    pcVar5 = "Unsupported output file format";
LAB_00137a92:
    GPU_PushErrorCode("GPU_SaveSurface",GPU_ERROR_DATA_ERROR,pcVar5);
    return false;
  }
  data = surface->pixels;
  switch(format) {
  case GPU_FILE_AUTO:
    pcVar3 = strrchr(filename,0x2e);
    pcVar5 = pcVar3 + 1;
    if (pcVar3 == filename) {
      pcVar5 = "";
    }
    if (pcVar3 == (char *)0x0) {
      pcVar5 = "";
    }
    lVar4 = 0;
    do {
      pbVar1 = (byte *)(pcVar5 + lVar4);
      if (""[*pbVar1] != ""[(byte)"data/test2.png"[lVar4 + 0xb]]) {
        lVar4 = 0;
        goto LAB_00137aab;
      }
      lVar4 = lVar4 + 1;
    } while (*pbVar1 != 0);
  case GPU_FILE_PNG:
    iVar2 = stbi_write_png(filename,iVar2,y,(uint)surface->format->BytesPerPixel,data,0);
    goto LAB_00137b1e;
  case GPU_FILE_TGA:
    goto switchD_00137a03_caseD_3;
  }
switchD_00137a03_caseD_2:
  iVar2 = stbi_write_bmp(filename,iVar2,y,(uint)surface->format->BytesPerPixel,data);
LAB_00137b1e:
  return 0 < iVar2;
  while (lVar4 = lVar4 + 1, *pbVar1 != 0) {
LAB_00137aab:
    pbVar1 = (byte *)(pcVar5 + lVar4);
    if (""[*pbVar1] != ""[(byte)"bmp"[lVar4]]) {
      lVar4 = 0;
      goto LAB_00137aea;
    }
  }
  goto switchD_00137a03_caseD_2;
  while (lVar4 = lVar4 + 1, *pbVar1 != 0) {
LAB_00137aea:
    pbVar1 = (byte *)(pcVar5 + lVar4);
    if (""[*pbVar1] != ""[(byte)"tga"[lVar4]]) {
      pcVar5 = "Could not detect output file format from file name";
      goto LAB_00137a92;
    }
  }
switchD_00137a03_caseD_3:
  iVar2 = stbi_write_tga(filename,iVar2,y,(uint)surface->format->BytesPerPixel,data);
  goto LAB_00137b1e;
}

Assistant:

GPU_bool GPU_SaveSurface(SDL_Surface* surface, const char* filename, GPU_FileFormatEnum format)
{
    GPU_bool result;
    unsigned char* data;

    if(surface == NULL || filename == NULL ||
            surface->w < 1 || surface->h < 1)
    {
        return GPU_FALSE;
    }


    data = surface->pixels;

    if(format == GPU_FILE_AUTO)
    {
        const char* extension = get_filename_ext(filename);
        if(gpu_strcasecmp(extension, "png") == 0)
            format = GPU_FILE_PNG;
        else if(gpu_strcasecmp(extension, "bmp") == 0)
            format = GPU_FILE_BMP;
        else if(gpu_strcasecmp(extension, "tga") == 0)
            format = GPU_FILE_TGA;
        else
        {
            GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Could not detect output file format from file name");
            return GPU_FALSE;
        }
    }

    switch(format)
    {
    case GPU_FILE_PNG:
        result = (stbi_write_png(filename, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data, 0) > 0);
        break;
    case GPU_FILE_BMP:
        result = (stbi_write_bmp(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    case GPU_FILE_TGA:
        result = (stbi_write_tga(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Unsupported output file format");
        result = GPU_FALSE;
        break;
    }

    return result;
}